

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O2

void __thiscall Nes_Namco::Nes_Namco(Nes_Namco *this)

{
  Blip_Synth<3,_15>::Blip_Synth(&this->synth);
  output(this,(Blip_Buffer *)0x0);
  Blip_Impulse_::volume_unit(&(this->synth).impulse,0.0008333333333333334);
  reset(this);
  return;
}

Assistant:

Nes_Namco::Nes_Namco()
{
	output( NULL );
	volume( 1.0 );
	reset();
}